

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

int canwearobj(obj *otmp,long *mask,boolean noisy)

{
  char cVar1;
  short sVar2;
  boolean bVar3;
  int iVar4;
  undefined8 uVar5;
  char *pcVar6;
  char *line;
  char *pcVar7;
  
  if (otmp->oclass == '\x03') {
    cVar1 = objects[otmp->otyp].oc_subtyp;
    if (cVar1 == '\x05') {
      pcVar7 = "cloak";
    }
    else if (cVar1 == '\x06') {
      pcVar7 = "shirt";
    }
    else {
      if (cVar1 != '\0') goto LAB_00186ab3;
      pcVar7 = "suit";
    }
    bVar3 = breakarm(youmonst.data);
    if ((((bVar3 != '\0') || (bVar3 = sliparm(youmonst.data), bVar3 != '\0')) &&
        ((cVar1 != '\x05' || ((youmonst.data)->msize != '\x01')))) &&
       (iVar4 = racial_exception(&youmonst,otmp), iVar4 < 1)) {
      if (noisy == '\0') {
        return 0;
      }
      pcVar6 = "The %s will not fit on your body.";
      goto LAB_00186c03;
    }
  }
LAB_00186ab3:
  if ((otmp->owornmask & 0x7f) != 0) {
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "that";
    uVar5 = 0x21;
    goto LAB_00186ad7;
  }
  iVar4 = welded(uwep);
  if (((iVar4 != 0) && ((byte)(uwep->oclass | 4U) == 6)) &&
     ((objects[uwep->otyp].field_0x11 & 1) != 0)) {
    if (otmp->oclass != '\x03') goto switchD_00186b63_default;
    if ((objects[otmp->otyp].oc_subtyp == '\x06') || (objects[otmp->otyp].oc_subtyp == '\0')) {
      if (noisy == '\0') {
        return 0;
      }
      pcVar7 = "weapon";
      if (((uwep->oclass == 2) && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
         (pcVar7 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
        pcVar7 = "sword";
      }
      pcVar6 = "You cannot do that while holding your %s.";
      goto LAB_00186c03;
    }
  }
  if (otmp->oclass != '\x03') {
switchD_00186b63_default:
    if (noisy != '\0') {
      silly_thing("wear",otmp);
    }
    return 0;
  }
  switch(objects[otmp->otyp].oc_subtyp) {
  case '\0':
    if (uarmc == (obj *)0x0) {
      if (uarm == (obj *)0x0) {
        *mask = 1;
        return 1;
      }
      if (noisy != '\0') {
        pcVar7 = "some armor";
        uVar5 = 0x2e;
        goto LAB_00186ad7;
      }
    }
    else if (noisy != '\0') {
      pcVar7 = cloak_simple_name(uarmc);
      pcVar6 = "You cannot wear armor over a %s.";
      goto LAB_00186c03;
    }
    return 0;
  case '\x01':
    if (uarms == (obj *)0x0) {
      if ((uwep != (obj *)0x0) && ((byte)(uwep->oclass | 4U) == 6)) {
        sVar2 = uwep->otyp;
        if ((objects[sVar2].field_0x11 & 1) != 0) {
          if (noisy == '\0') {
            return 0;
          }
          if ((uwep->oclass == 2) && ((byte)(objects[sVar2].oc_subtyp - 5U) < 6)) {
            pcVar7 = "sword";
          }
          else {
            pcVar7 = "weapon";
            if (sVar2 == 0x1c) {
              pcVar7 = "axe";
            }
          }
          pcVar6 = "You cannot wear a shield while wielding a two-handed %s.";
          goto LAB_00186c03;
        }
      }
      if (u.twoweap == '\0') {
        *mask = 8;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      pcVar7 = "You cannot wear a shield while wielding two weapons.";
LAB_00186ffe:
      pline(pcVar7);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "shield";
    break;
  case '\x02':
    if (uarmh == (obj *)0x0) {
      if (((u.umonnum == u.umonster) || (iVar4 = num_horns(youmonst.data), iVar4 < 1)) ||
         (((long)otmp->otyp == 0x3d || ((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x180) == 0)))
         ) {
        *mask = 4;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      iVar4 = num_horns(youmonst.data);
      pcVar6 = "s";
      if (iVar4 == 1) {
        pcVar6 = "";
      }
      line = "The %s won\'t fit over your horn%s.";
      pcVar7 = "helmet";
LAB_00187071:
      pline(line,pcVar7,pcVar6);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "helmet";
    break;
  case '\x03':
    if (uarmg == (obj *)0x0) {
      iVar4 = welded(uwep);
      if (iVar4 == 0) {
        *mask = 0x10;
        return 1;
      }
      if (noisy == '\0') {
        return 0;
      }
      pcVar7 = "weapon";
      if (((uwep->oclass == '\x02') && ('\x04' < objects[uwep->otyp].oc_subtyp)) &&
         (pcVar7 = "weapon", (byte)objects[uwep->otyp].oc_subtyp < 0xb)) {
        pcVar7 = "sword";
      }
      pcVar6 = "You cannot wear gloves over your %s.";
LAB_00186c03:
      pline(pcVar6,pcVar7);
      return 0;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "gloves";
    goto LAB_00186ca2;
  case '\x04':
    if (uarmf == (obj *)0x0) {
      if (u.umonnum != u.umonster) {
        if (((youmonst.data)->mflags1 & 0x80000) != 0) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar7 = "You have no feet...";
          goto LAB_00186ffe;
        }
        if ((youmonst.data)->mlet == '\x1d') {
          if (noisy == '\0') {
            return 0;
          }
          pcVar6 = "You have too many hooves to wear %s.";
          pcVar7 = "boots";
          goto LAB_00186c03;
        }
      }
      if (u.utrap != 0) {
        if (u.utraptype == 4) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar7 = body_part(5);
          pcVar7 = makeplural(pcVar7);
          pcVar6 = surface((int)u.ux,(int)u.uy);
          line = "Your %s are stuck in the %s!";
          goto LAB_00187071;
        }
        if (u.utraptype == 0) {
          if (noisy == '\0') {
            return 0;
          }
          pcVar7 = body_part(5);
          pcVar6 = "Your %s is trapped!";
          goto LAB_00186c03;
        }
      }
      *mask = 0x20;
      return 1;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "boots";
LAB_00186ca2:
    uVar5 = 0x2e;
    goto LAB_00186ad7;
  case '\x05':
    if (uarmc == (obj *)0x0) {
      *mask = 2;
      return 1;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = cloak_simple_name(uarmc);
    break;
  case '\x06':
    if ((uarm == (obj *)0x0 && uarmc == (obj *)0x0) && uarmu == (obj *)0x0) {
      *mask = 0x40;
      return 1;
    }
    if (uarmu == (obj *)0x0) {
      if (noisy == '\0') {
        return 0;
      }
      if (uarm == (obj *)0x0 || uarmc != (obj *)0x0) {
        pcVar7 = cloak_simple_name(uarmc);
      }
      else {
        pcVar7 = "armor";
      }
      pcVar6 = "You can\'t wear that over your %s.";
      goto LAB_00186c03;
    }
    if (noisy == '\0') {
      return 0;
    }
    pcVar7 = "shirt";
    break;
  default:
    goto switchD_00186b63_default;
  }
  pcVar7 = an(pcVar7);
  uVar5 = 0x2e;
  if (pcVar7 == "that") {
    uVar5 = 0x21;
  }
LAB_00186ad7:
  pline("You are already wearing %s%c",pcVar7,uVar5);
  return 0;
}

Assistant:

int canwearobj(struct obj *otmp, long *mask, boolean noisy)
{
    int err = 0;
    const char *which;

    which = is_cloak(otmp) ? c_cloak :
	    is_shirt(otmp) ? c_shirt :
	    is_suit(otmp) ? c_suit : 0;
    if (which && cantweararm(youmonst.data) &&
	    /* same exception for cloaks as used in m_dowear() */
	    (which != c_cloak || youmonst.data->msize != MZ_SMALL) &&
	    (racial_exception(&youmonst, otmp) < 1)) {
	if (noisy) pline("The %s will not fit on your body.", which);
	return 0;
    } else if (otmp->owornmask & W_ARMOR) {
	if (noisy) already_wearing(c_that_);
	return 0;
    }

    if (welded(uwep) && bimanual(uwep) && (is_suit(otmp) || is_shirt(otmp))) {
	if (noisy)
	    pline("You cannot do that while holding your %s.",
		is_sword(uwep) ? c_sword : c_weapon);
	return 0;
    }

    if (is_helmet(otmp)) {
	if (uarmh) {
	    if (noisy) already_wearing(an(c_helmet));
	    err++;
	} else if (Upolyd && has_horns(youmonst.data) && !is_flimsy(otmp)) {
	    /* (flimsy exception matches polyself handling) */
	    if (noisy)
		pline("The %s won't fit over your horn%s.",
			  c_helmet, plur(num_horns(youmonst.data)));
	    err++;
	} else
	    *mask = W_ARMH;
    } else if (is_shield(otmp)) {
	if (uarms) {
	    if (noisy) already_wearing(an(c_shield));
	    err++;
	} else if (uwep && bimanual(uwep)) {
	    if (noisy) 
		pline("You cannot wear a shield while wielding a two-handed %s.",
		    is_sword(uwep) ? c_sword :
		    (uwep->otyp == BATTLE_AXE) ? c_axe : c_weapon);
	    err++;
	} else if (u.twoweap) {
	    if (noisy)
		pline("You cannot wear a shield while wielding two weapons.");
	    err++;
	} else
	    *mask = W_ARMS;
    } else if (is_boots(otmp)) {
	if (uarmf) {
	    if (noisy) already_wearing(c_boots);
	    err++;
	} else if (Upolyd && slithy(youmonst.data)) {
	    if (noisy) pline("You have no feet...");	/* not body_part(FOOT) */
	    err++;
	} else if (Upolyd && youmonst.data->mlet == S_CENTAUR) {
	    /* break_armor() pushes boots off for centaurs,
	       so don't let dowear() put them back on... */
	    if (noisy) pline("You have too many hooves to wear %s.",
			     c_boots);	/* makeplural(body_part(FOOT)) yields
					   "rear hooves" which sounds odd */
	    err++;
	} else if (u.utrap && (u.utraptype == TT_BEARTRAP ||
				u.utraptype == TT_INFLOOR)) {
	    if (u.utraptype == TT_BEARTRAP) {
		if (noisy) pline("Your %s is trapped!", body_part(FOOT));
	    } else {
		if (noisy) pline("Your %s are stuck in the %s!",
				makeplural(body_part(FOOT)),
				surface(u.ux, u.uy));
	    }
	    err++;
	} else
	    *mask = W_ARMF;
    } else if (is_gloves(otmp)) {
	if (uarmg) {
	    if (noisy) already_wearing(c_gloves);
	    err++;
	} else if (welded(uwep)) {
	    if (noisy) pline("You cannot wear gloves over your %s.",
			   is_sword(uwep) ? c_sword : c_weapon);
	    err++;
	} else
	    *mask = W_ARMG;
    } else if (is_shirt(otmp)) {
	if (uarm || uarmc || uarmu) {
	    if (uarmu) {
		if (noisy) already_wearing(an(c_shirt));
	    } else {
		if (noisy) pline("You can't wear that over your %s.",
			           (uarm && !uarmc) ? c_armor : cloak_simple_name(uarmc));
	    }
	    err++;
	} else
	    *mask = W_ARMU;
    } else if (is_cloak(otmp)) {
	if (uarmc) {
	    if (noisy) already_wearing(an(cloak_simple_name(uarmc)));
	    err++;
	} else
	    *mask = W_ARMC;
    } else if (is_suit(otmp)) {
	if (uarmc) {
	    if (noisy) pline("You cannot wear armor over a %s.", cloak_simple_name(uarmc));
	    err++;
	} else if (uarm) {
	    if (noisy) already_wearing("some armor");
	    err++;
	} else
	    *mask = W_ARM;
    } else {
	/* getobj can't do this after setting its allow_all flag; that
	   happens if you have armor for slots that are covered up or
	   extra armor for slots that are filled */
	if (noisy) silly_thing("wear", otmp);
	err++;
    }
    return !err;
}